

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageRestrictionManager.cpp
# Opt level: O2

void __thiscall
jaegertracing::thrift::BaggageRestrictionManagerClient::send_getBaggageRestrictions
          (BaggageRestrictionManagerClient *this,string *serviceName)

{
  TProtocol *pTVar1;
  size_t __n;
  void *__buf;
  __shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> local_48;
  BaggageRestrictionManager_getBaggageRestrictions_pargs args;
  
  pTVar1 = this->oprot_;
  std::__cxx11::string::string((string *)&args,"getBaggageRestrictions",(allocator *)&local_48);
  __n = 0;
  (*pTVar1->_vptr_TProtocol[2])(pTVar1,&args,1);
  std::__cxx11::string::~string((string *)&args);
  args._vptr_BaggageRestrictionManager_getBaggageRestrictions_pargs =
       (_func_int **)&PTR__BaggageRestrictionManager_getBaggageRestrictions_pargs_00299de8;
  args.serviceName = serviceName;
  BaggageRestrictionManager_getBaggageRestrictions_pargs::write(&args,(int)this->oprot_,__buf,__n);
  (*this->oprot_->_vptr_TProtocol[3])();
  std::__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,
             &(this->oprot_->ptrans_).
              super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>)
  ;
  (*(local_48._M_ptr)->_vptr_TTransport[10])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,
             &(this->oprot_->ptrans_).
              super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>)
  ;
  (*(local_48._M_ptr)->_vptr_TTransport[0xb])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  BaggageRestrictionManager_getBaggageRestrictions_pargs::
  ~BaggageRestrictionManager_getBaggageRestrictions_pargs(&args);
  return;
}

Assistant:

void BaggageRestrictionManagerClient::send_getBaggageRestrictions(const std::string& serviceName)
{
  int32_t cseqid = 0;
  oprot_->writeMessageBegin("getBaggageRestrictions", ::apache::thrift::protocol::T_CALL, cseqid);

  BaggageRestrictionManager_getBaggageRestrictions_pargs args;
  args.serviceName = &serviceName;
  args.write(oprot_);

  oprot_->writeMessageEnd();
  oprot_->getTransport()->writeEnd();
  oprot_->getTransport()->flush();
}